

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          Scope *args,TypeParameterDeclarationSyntax *args_1,TypeAssignmentSyntax *args_2,
          bool *args_3,bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  ulong uVar1;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar2;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar3;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar4;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar5;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar8;
  ParameterDecl *__cur_1;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar9;
  ParameterDecl *this_00;
  pointer pPVar10;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar11;
  pointer pPVar12;
  ulong uVar13;
  long lVar14;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar1 = this->cap;
  if (uVar13 < uVar1 * 2) {
    uVar13 = uVar1 * 2;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    uVar13 = 0x1ffffffffffffff;
  }
  lVar14 = (long)pos - (long)this->data_;
  paVar9 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar13 << 6);
  this_00 = (ParameterDecl *)((long)paVar9 + lVar14);
  ast::DefinitionSymbol::ParameterDecl::ParameterDecl
            (this_00,args,args_1,args_2,*args_3,*args_4,*args_5);
  pPVar12 = this->data_;
  pPVar10 = pPVar12 + this->len;
  paVar11 = paVar9;
  if (pPVar10 == pos) {
    for (; pPVar12 != pos; pPVar12 = pPVar12 + 1) {
      aVar2 = pPVar12->field_0;
      aVar3 = pPVar12->field_1;
      aVar4 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->name)._M_len;
      aVar5 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->name)._M_str;
      aVar6 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar12->location;
      aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->attributes)._M_ptr;
      aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar12->isTypeParam;
      paVar11[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar12->attributes)._M_extent._M_extent_value;
      paVar11[7] = aVar8;
      paVar11[4] = aVar6;
      paVar11[5] = aVar7;
      paVar11[2] = aVar4;
      paVar11[3] = aVar5;
      *paVar11 = aVar2;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar11 + 1) = aVar3;
      paVar11 = paVar11 + 8;
    }
  }
  else {
    for (; pPVar12 != pos; pPVar12 = pPVar12 + 1) {
      aVar2 = pPVar12->field_0;
      aVar3 = pPVar12->field_1;
      aVar4 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->name)._M_len;
      aVar5 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->name)._M_str;
      aVar6 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar12->location;
      aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pPVar12->attributes)._M_ptr;
      aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pPVar12->isTypeParam;
      paVar11[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                   (pPVar12->attributes)._M_extent._M_extent_value;
      paVar11[7] = aVar8;
      paVar11[4] = aVar6;
      paVar11[5] = aVar7;
      paVar11[2] = aVar4;
      paVar11[3] = aVar5;
      *paVar11 = aVar2;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar11 + 1) = aVar3;
      paVar11 = paVar11 + 8;
    }
    paVar11 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)(lVar14 + (long)paVar9);
    for (; pos != pPVar10; pos = pos + 1) {
      aVar2 = pos->field_0;
      aVar3 = pos->field_1;
      aVar4 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->name)._M_len;
      aVar5 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->name)._M_str;
      aVar6 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pos->location;
      aVar7 = (anon_union_8_3_62382250_for_ParameterDecl_0)(pos->attributes)._M_ptr;
      aVar8 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&pos->isTypeParam;
      paVar11[0xe] = (anon_union_8_3_62382250_for_ParameterDecl_0)
                     (pos->attributes)._M_extent._M_extent_value;
      paVar11[0xf] = aVar8;
      paVar11[0xc] = aVar6;
      paVar11[0xd] = aVar7;
      paVar11[10] = aVar4;
      paVar11[0xb] = aVar5;
      paVar11[8] = aVar2;
      *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(paVar11 + 9) = aVar3;
      paVar11 = paVar11 + 8;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = uVar13;
  this->data_ = (pointer)paVar9;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}